

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O1

void __thiscall
icu_63::numparse::impl::NumberParserImpl::NumberParserImpl
          (NumberParserImpl *this,parse_flags_t parseFlags)

{
  (this->super_MutableMatcherCollection)._vptr_MutableMatcherCollection =
       (_func_int **)&PTR__NumberParserImpl_003ead38;
  this->fParseFlags = parseFlags;
  this->fNumMatchers = 0;
  (this->fMatchers).ptr = (this->fMatchers).stackArray;
  (this->fMatchers).capacity = 10;
  (this->fMatchers).needToRelease = '\0';
  this->fFrozen = false;
  {unnamed_type#1}::NumberParserImpl((_unnamed_type_1_ *)&this->fLocalMatchers);
  (this->fLocalValidators).affix.super_ValidationMatcher.super_NumberParseMatcher.
  _vptr_NumberParseMatcher = (_func_int **)&PTR__NumberParseMatcher_003eb398;
  (this->fLocalValidators).currency.super_ValidationMatcher.super_NumberParseMatcher.
  _vptr_NumberParseMatcher = (_func_int **)&PTR__NumberParseMatcher_003eb418;
  (this->fLocalValidators).decimalSeparator.super_ValidationMatcher.super_NumberParseMatcher.
  _vptr_NumberParseMatcher = (_func_int **)&PTR__NumberParseMatcher_003eb308;
  (this->fLocalValidators).number.super_ValidationMatcher.super_NumberParseMatcher.
  _vptr_NumberParseMatcher = (_func_int **)&PTR__NumberParseMatcher_003eb4d0;
  (this->fLocalValidators).multiplier.super_ValidationMatcher.super_NumberParseMatcher.
  _vptr_NumberParseMatcher = (_func_int **)&PTR__MultiplierParseHandler_003eb350;
  (this->fLocalValidators).multiplier.fMultiplier.fMagnitude = 0;
  (this->fLocalValidators).multiplier.fMultiplier.fArbitrary = (DecNum *)0x0;
  (this->fLocalValidators).multiplier.fMultiplier.fError = U_ZERO_ERROR;
  return;
}

Assistant:

NumberParserImpl::NumberParserImpl(parse_flags_t parseFlags)
        : fParseFlags(parseFlags) {
}